

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mip_level::unflip
          (mip_level *this,bool allow_unpacking_to_flip,bool uncook_if_necessary_to_unpack)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte in_DL;
  byte in_SIL;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  dxt_image *in_stack_00000008;
  undefined6 in_stack_ffffffffffffffe8;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  bool local_1;
  
  bVar3 = in_SIL & 1;
  bVar1 = in_DL & 1;
  this_00 = in_RDI;
  bVar2 = is_valid((mip_level *)in_RDI);
  if (bVar2) {
    bVar2 = is_flipped((mip_level *)in_RDI);
    if (bVar2) {
      bVar2 = is_packed((mip_level *)in_RDI);
      if (bVar2) {
        bVar2 = can_unflip_without_unpacking
                          ((mip_level *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
        if (bVar2) {
          if (((ulong)(in_RDI->m_pixel_buf).m_p & 1) != 0) {
            dxt_image::flip_x(in_stack_00000008);
            *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p =
                 *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p & ~cOrientationFlagXFlipped;
          }
          if (((ulong)(in_RDI->m_pixel_buf).m_p & 2) != 0) {
            dxt_image::flip_y(in_stack_00000008);
            *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p =
                 *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p & ~cOrientationFlagYFlipped;
          }
          return true;
        }
        if ((bVar3 & 1) == 0) {
          return false;
        }
      }
      unpack_from_dxt((mip_level *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),
                      SUB81((ulong)in_RDI >> 0x38,0));
      if (((ulong)(in_RDI->m_pixel_buf).m_p & 1) != 0) {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_x(this_00);
        *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p =
             *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p & ~cOrientationFlagXFlipped;
      }
      if (((ulong)(in_RDI->m_pixel_buf).m_p & 2) != 0) {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(this_00);
        *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p =
             *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p & ~cOrientationFlagYFlipped;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool mip_level::unflip(bool allow_unpacking_to_flip, bool uncook_if_necessary_to_unpack) {
  if (!is_valid())
    return false;

  if (!is_flipped())
    return false;

  if (is_packed()) {
    if (can_unflip_without_unpacking()) {
      if (m_orient_flags & cOrientationFlagXFlipped) {
        m_pDXTImage->flip_x();
        m_orient_flags = static_cast<orientation_flags_t>(m_orient_flags & ~cOrientationFlagXFlipped);
      }

      if (m_orient_flags & cOrientationFlagYFlipped) {
        m_pDXTImage->flip_y();
        m_orient_flags = static_cast<orientation_flags_t>(m_orient_flags & ~cOrientationFlagYFlipped);
      }

      return true;
    }

    if (!allow_unpacking_to_flip)
      return false;
  }

  unpack_from_dxt(uncook_if_necessary_to_unpack);

  if (m_orient_flags & cOrientationFlagXFlipped) {
    m_pImage->flip_x();
    m_orient_flags = static_cast<orientation_flags_t>(m_orient_flags & ~cOrientationFlagXFlipped);
  }

  if (m_orient_flags & cOrientationFlagYFlipped) {
    m_pImage->flip_y();
    m_orient_flags = static_cast<orientation_flags_t>(m_orient_flags & ~cOrientationFlagYFlipped);
  }

  return true;
}